

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

LocalScopeInfoIdToScopeInfoMap * __thiscall
Js::ByteCodeCache::EnsureLocalScopeInfoIdToScopeInfoMap
          (ByteCodeCache *this,ScriptContext *scriptContext)

{
  BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  
  this_00 = this->localScopeInfoIdToScopeInfoMap;
  if (this_00 ==
      (BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    this_00 = (BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::ArenaAllocator>(0x38,&scriptContext->sourceCodeAllocator,0x35916e);
    JsUtil::
    BaseDictionary<unsigned_int,_Js::ScopeInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,&scriptContext->sourceCodeAllocator,10);
    this->localScopeInfoIdToScopeInfoMap = this_00;
  }
  return this_00;
}

Assistant:

ByteCodeCache::LocalScopeInfoIdToScopeInfoMap * ByteCodeCache::EnsureLocalScopeInfoIdToScopeInfoMap(ScriptContext * scriptContext)
{
    if (this->localScopeInfoIdToScopeInfoMap == nullptr)
    {
        this->localScopeInfoIdToScopeInfoMap = Anew(scriptContext->SourceCodeAllocator(), LocalScopeInfoIdToScopeInfoMap, scriptContext->SourceCodeAllocator(), 10);
    }
    Assert(this->localScopeInfoIdToScopeInfoMap != nullptr);
    return this->localScopeInfoIdToScopeInfoMap;
}